

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O2

char * __thiscall
MeCab::anon_unknown_0::LatticeImpl::enumNBestAsStringInternal
          (LatticeImpl *this,size_t N,StringBuffer *os)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _func_int **pp_Var4;
  StringBuffer *in_RCX;
  StringBuffer *__buf;
  StringBuffer *extraout_RDX;
  StringBuffer *extraout_RDX_00;
  StringBuffer *extraout_RDX_01;
  StringBuffer *extraout_RDX_02;
  char *pcVar5;
  bool bVar6;
  Node local_98;
  
  os->size_ = 0;
  __buf = os;
  if (N - 0x201 < 0xfffffffffffffe00) {
    pp_Var4 = (this->super_Lattice)._vptr_Lattice;
    pcVar5 = "nbest size must be 1 <= nbest <= 512";
LAB_001522c3:
    (*pp_Var4[0x25])(this,pcVar5);
  }
  else {
    do {
      while( true ) {
        bVar6 = N == 0;
        N = N - 1;
        if ((bVar6) ||
           (iVar1 = (*(this->super_Lattice)._vptr_Lattice[0x10])(this), __buf = extraout_RDX,
           (char)iVar1 == '\0')) {
          if (this->writer_ != (Writer *)0x0) {
            local_98.id = 0;
            local_98.length = 0;
            local_98.rlength = 0;
            local_98.wcost = 0;
            local_98._98_6_ = 0;
            local_98.cost = 0;
            local_98.isbest = '\0';
            local_98._81_3_ = 0;
            local_98.alpha = 0.0;
            local_98.beta = 0.0;
            local_98.prob = 0.0;
            local_98.surface = (char *)0x0;
            local_98.feature = (char *)0x0;
            local_98.rpath = (mecab_path_t *)0x0;
            local_98.lpath = (mecab_path_t *)0x0;
            local_98.enext = (mecab_node_t *)0x0;
            local_98.bnext = (mecab_node_t *)0x0;
            local_98.prev = (mecab_node_t *)0x0;
            local_98.next = (mecab_node_t *)0x0;
            local_98.rcAttr = 0;
            local_98.lcAttr = 0;
            local_98.posid = 0;
            local_98.char_type = '\0';
            local_98.stat = '\x04';
            iVar1 = (*(this->super_Lattice)._vptr_Lattice[8])(this);
            iVar2 = (*(this->super_Lattice)._vptr_Lattice[0xb])(this);
            local_98.surface =
                 (char *)(CONCAT44(extraout_var_00,iVar2) + CONCAT44(extraout_var,iVar1));
            in_RCX = os;
            bVar6 = Writer::writeNode(this->writer_,&this->super_Lattice,&local_98,os);
            __buf = extraout_RDX_02;
            if (!bVar6) {
              return (char *)0x0;
            }
          }
          StringBuffer::write(os,0,__buf,(size_t)in_RCX);
          if ((os->ptr_ == (char *)0x0 | os->error_) != 1) {
            return os->ptr_;
          }
          pp_Var4 = (this->super_Lattice)._vptr_Lattice;
          pcVar5 = "output buffer overflow";
          goto LAB_001522c3;
        }
        if (this->writer_ != (Writer *)0x0) break;
        anon_unknown_3::writeLattice(&this->super_Lattice,os);
        __buf = extraout_RDX_01;
      }
      sVar3 = Writer::write(this->writer_,(int)this,os,(size_t)in_RCX);
      __buf = extraout_RDX_00;
    } while ((char)sVar3 != '\0');
  }
  return (char *)0x0;
}

Assistant:

Node *lookup(const char *begin, const char *end,
               Lattice *lattice) const {
    return viterbi_->tokenizer()->lookup<false>(
        begin, end,
        lattice->allocator(), lattice);
  }